

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O1

void bb_uses(dill_stream c,basic_block_conflict bb,int vreg)

{
  char *pcVar1;
  anon_struct_4_2_0bc3ac41_for_use_info *paVar2;
  int iVar3;
  uint uVar4;
  
  if (99 < vreg) {
    iVar3 = (int)(vreg - 100U) >> 3;
    uVar4 = vreg - 100U & 7;
    if (((byte)bb->regs_defined->vec[iVar3] >> uVar4 & 1) == 0) {
      pcVar1 = bb->regs_used->vec + iVar3;
      *pcVar1 = *pcVar1 | (byte)(1 << (sbyte)uVar4);
    }
    paVar2 = &c->p->vregs[(ulong)(uint)vreg - 100].use_info;
    paVar2->use_count = paVar2->use_count + 1;
  }
  return;
}

Assistant:

static void
bb_uses(dill_stream c, basic_block bb, int vreg)
{
    if (vreg >= 100) {
        /* not param */
        if (!bit_vec_is_set(bb->regs_defined, vreg - 100)) {
            bit_vec_set(bb->regs_used, vreg - 100);
        }
        set_used(c, vreg);
    }
}